

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool S2BooleanOperation::IsEmpty(OpType op_type,S2ShapeIndex *a,S2ShapeIndex *b,Options *options)

{
  bool result_empty;
  S2LogMessage local_c0;
  S2Error error;
  S2BooleanOperation op;
  
  S2BooleanOperation(&op,op_type,&result_empty,options);
  error.code_ = OK;
  error.text_._M_dataplus._M_p = (pointer)&error.text_.field_2;
  error.text_._M_string_length = 0;
  error.text_.field_2._M_local_buf[0] = '\0';
  Build(&op,a,b,&error);
  if (error.code_ == OK) {
    std::__cxx11::string::~string((string *)&error.text_);
    ~S2BooleanOperation(&op);
    return result_empty;
  }
  S2LogMessage::S2LogMessage
            (&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x955,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_c0.stream_,"Check failed: error.ok() ");
  abort();
}

Assistant:

bool S2BooleanOperation::IsEmpty(
    OpType op_type, const S2ShapeIndex& a, const S2ShapeIndex& b,
    const Options& options) {
  bool result_empty;
  S2BooleanOperation op(op_type, &result_empty, options);
  S2Error error;
  op.Build(a, b, &error);
  S2_DCHECK(error.ok());
  return result_empty;
}